

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt1.h
# Opt level: O0

int __thiscall crnlib::qdxt1_params::init(qdxt1_params *this,EVP_PKEY_CTX *ctx)

{
  byte in_CL;
  uint in_EDX;
  bool hierarchical_local;
  int quality_level_local;
  pack_params *pp_local;
  qdxt1_params *this_local;
  
  this->m_dxt_quality = *(crn_dxt_quality *)(ctx + 8);
  this->m_hierarchical = (bool)(in_CL & 1);
  this->m_perceptual = (bool)((byte)ctx[0x10] & 1);
  this->m_use_alpha_blocks = (bool)((byte)ctx[0x13] & 1);
  this->m_quality_level = in_EDX;
  this->m_dxt1a_alpha_threshold = *(uint *)ctx;
  return (int)this;
}

Assistant:

void init(const dxt_image::pack_params& pp, int quality_level, bool hierarchical)
        {
            m_dxt_quality = pp.m_quality;
            m_hierarchical = hierarchical;
            m_perceptual = pp.m_perceptual;
            m_use_alpha_blocks = pp.m_use_both_block_types;
            m_quality_level = quality_level;
            m_dxt1a_alpha_threshold = pp.m_dxt1a_alpha_threshold;
        }